

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O2

KBOOL __thiscall KDIS::DATA_TYPE::RecordSet::operator==(RecordSet *this,RecordSet *Value)

{
  bool bVar1;
  
  if ((((this->m_ui32RecID == Value->m_ui32RecID) &&
       (this->m_ui32RecSetSerialNum == Value->m_ui32RecSetSerialNum)) &&
      (this->m_ui16RecLen == Value->m_ui16RecLen)) && (this->m_ui16RecCnt == Value->m_ui16RecCnt)) {
    bVar1 = std::operator!=(&this->m_vui8RecVals,&Value->m_vui8RecVals);
    return !bVar1;
  }
  return false;
}

Assistant:

KBOOL RecordSet::operator == ( const RecordSet & Value ) const
{
    if( m_ui32RecID           != Value.m_ui32RecID )            return false;
    if( m_ui32RecSetSerialNum != Value.m_ui32RecSetSerialNum )  return false;
    if( m_ui16RecLen          != Value.m_ui16RecLen )           return false;
    if( m_ui16RecCnt          != Value.m_ui16RecCnt )           return false;
    if( m_vui8RecVals         != Value.m_vui8RecVals )          return false;
    return true;
}